

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

int floatx80_eq_quiet_arm(floatx80 a,floatx80 b,float_status *status)

{
  unkuint10 Var1;
  unkuint10 Var2;
  _Bool _Var3;
  int32_t iVar4;
  int iVar5;
  uint64_t uVar6;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  floatx80 a_04;
  floatx80 a_05;
  floatx80 a_06;
  floatx80 a_07;
  bool local_3b;
  bool local_3a;
  bool local_39;
  float_status *status_local;
  floatx80 b_local;
  floatx80 a_local;
  
  Var2 = a._0_10_;
  a_00._10_6_ = 0;
  a_00.low = (long)Var2;
  a_00.high = (short)(Var2 >> 0x40);
  _Var3 = floatx80_invalid_encoding(a_00);
  if (!_Var3) {
    Var1 = b._0_10_;
    a_01._10_6_ = 0;
    a_01.low = (long)Var1;
    a_01.high = (short)(Var1 >> 0x40);
    _Var3 = floatx80_invalid_encoding(a_01);
    if (!_Var3) {
      a_02._10_6_ = 0;
      a_02.low = (long)Var2;
      a_02.high = (short)(Var2 >> 0x40);
      iVar4 = extractFloatx80Exp(a_02);
      if (((iVar4 != 0x7fff) ||
          (a_03._10_6_ = 0, a_03.low = (long)Var2, a_03.high = (short)(Var2 >> 0x40),
          uVar6 = extractFloatx80Frac(a_03), (uVar6 & 0x7fffffffffffffff) == 0)) &&
         ((a_04._10_6_ = 0, a_04.low = (long)Var1, a_04.high = (short)(Var1 >> 0x40),
          iVar4 = extractFloatx80Exp(a_04), iVar4 != 0x7fff ||
          (a_05._10_6_ = 0, a_05.low = (long)Var1, a_05.high = (short)(Var1 >> 0x40),
          uVar6 = extractFloatx80Frac(a_05), (uVar6 & 0x7fffffffffffffff) == 0)))) {
        local_39 = false;
        if (a.low == b.low) {
          local_3a = true;
          if (a.high != b.high) {
            local_3b = a.low == 0 && ((a.high | b.high) & 0x7fff) == 0;
            local_3a = local_3b;
          }
          local_39 = local_3a;
        }
        return (uint)local_39;
      }
      a_06._10_6_ = 0;
      a_06.low = (long)Var2;
      a_06.high = (short)(Var2 >> 0x40);
      iVar5 = floatx80_is_signaling_nan_arm(a_06,status);
      if ((iVar5 != 0) ||
         (a_07._10_6_ = 0, a_07.low = (long)Var1, a_07.high = (short)(Var1 >> 0x40),
         iVar5 = floatx80_is_signaling_nan_arm(a_07,status), iVar5 != 0)) {
        float_raise_arm('\x01',status);
      }
      return 0;
    }
  }
  float_raise_arm('\x01',status);
  return 0;
}

Assistant:

int floatx80_eq_quiet(floatx80 a, floatx80 b, float_status *status)
{

    if (floatx80_invalid_encoding(a) || floatx80_invalid_encoding(b)) {
        float_raise(float_flag_invalid, status);
        return 0;
    }
    if (    (    ( extractFloatx80Exp( a ) == 0x7FFF )
              && (uint64_t) ( extractFloatx80Frac( a )<<1 ) )
         || (    ( extractFloatx80Exp( b ) == 0x7FFF )
              && (uint64_t) ( extractFloatx80Frac( b )<<1 ) )
       ) {
        if (floatx80_is_signaling_nan(a, status)
         || floatx80_is_signaling_nan(b, status)) {
            float_raise(float_flag_invalid, status);
        }
        return 0;
    }
    return
           ( a.low == b.low )
        && (    ( a.high == b.high )
             || (    ( a.low == 0 )
                  && ( (uint16_t) ( ( a.high | b.high )<<1 ) == 0 ) )
           );

}